

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O3

void __thiscall
pbrt::DigitPermutation::DigitPermutation
          (DigitPermutation *this,int base,uint32_t seed,Allocator alloc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint16_t *puVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  int vb;
  int va;
  undefined4 extraout_var;
  
  this->base = base;
  vb = 0x10000;
  va = base;
  if (0xffff < base) {
    LogFatal<char_const(&)[5],char_const(&)[6],char_const(&)[5],int&,char_const(&)[6],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/lowdiscrepancy.h"
               ,0x1e,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [5])"base",
               (char (*) [6])"65536",(char (*) [5])"base",&va,(char (*) [6])"65536",&vb);
  }
  fVar11 = 1.0;
  iVar6 = 0;
  uVar1 = 0;
  do {
    fVar11 = (1.0 / (float)base) * fVar11;
    uVar1 = uVar1 + 1;
    iVar6 = iVar6 + base;
  } while (1.0 - fVar11 < 1.0);
  this->nDigits = uVar1;
  if (base == 0) {
    this->permutations = (uint16_t *)0x0;
    puVar4 = (uint16_t *)0x0;
  }
  else {
    iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)iVar6 * 2,2);
    puVar4 = (uint16_t *)CONCAT44(extraout_var,iVar6);
    uVar1 = this->nDigits;
    this->permutations = puVar4;
    if ((int)uVar1 < 1) {
      return;
    }
  }
  uVar10 = 0;
  uVar8 = base - 1U >> 1 | base - 1U;
  uVar8 = uVar8 >> 2 | uVar8;
  uVar8 = uVar8 >> 4 | uVar8;
  uVar8 = uVar8 >> 8 | uVar8;
  uVar8 = uVar8 >> 0x10 | uVar8;
  do {
    if (0 < base) {
      uVar9 = 0;
      uVar2 = base * 0x100 + (int)uVar10 ^ seed;
      uVar7 = (ulong)(uVar2 >> 0x1f ^ uVar2) * 0x7fb5d329728ea185;
      lVar5 = (uVar7 >> 0x1b ^ uVar7) * -0x7e25210b43d22bb3;
      uVar2 = (uint)((ulong)lVar5 >> 0x21) ^ (uint)lVar5;
      do {
        uVar7 = uVar9 & 0xffffffff;
        do {
          uVar3 = ((uint)uVar7 ^ uVar2) * -0x1e8f76c3 ^ uVar2 >> 0x10;
          uVar3 = ((uVar3 & uVar8) >> 4 ^ uVar2 >> 8 ^ uVar3) * 0x929eb3f ^ uVar2 >> 0x17;
          uVar3 = ((uVar3 & uVar8) >> 1 ^ uVar3) * (uVar2 >> 0x1b | 1) * 0x6935fa69;
          uVar3 = ((uVar3 & uVar8) >> 0xb ^ uVar3) * 0x74dcb303;
          uVar3 = ((uVar3 & uVar8) >> 2 ^ uVar3) * -0x61afe33d;
          uVar3 = ((uVar3 & uVar8) >> 2 ^ uVar3) * -0x379f5c21 & uVar8;
          uVar3 = uVar3 >> 5 ^ uVar3;
          uVar7 = (ulong)uVar3;
        } while ((uint)base <= uVar3);
        lVar5 = uVar9 + uVar10 * (uint)base;
        uVar9 = uVar9 + 1;
        puVar4[lVar5] = (uint16_t)((uVar3 + uVar2) % (uint)base);
      } while (uVar9 != (uint)base);
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar1);
  return;
}

Assistant:

DigitPermutation(int base, uint32_t seed, Allocator alloc) : base(base) {
        CHECK_LT(base, 65536);  // uint16_t
        // Compute number of digits needed for _base_
        nDigits = 0;
        Float invBase = (Float)1 / (Float)base, invBaseN = 1;
        while (1 - invBaseN < 1) {
            ++nDigits;
            invBaseN *= invBase;
        }

        permutations = alloc.allocate_object<uint16_t>(nDigits * base);
        for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
            // Compute random permutation for _digitIndex_
            uint32_t digitSeed = MixBits(((base << 8) + digitIndex) ^ seed);
            for (int digitValue = 0; digitValue < base; ++digitValue) {
                int index = digitIndex * base + digitValue;
                permutations[index] = PermutationElement(digitValue, base, digitSeed);
            }
        }
    }